

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::mlFg_Report(HModel *this)

{
  long in_RDI;
  
  printf("\nReporting model/solver status and flags:\n\n");
  printf("problemStatus =          %2d\n",(ulong)*(uint *)(in_RDI + 0x618));
  printf("numberIteration =        %2d\n\n",(ulong)*(uint *)(in_RDI + 0x588));
  printf("mlFg_transposedLP =      %2d\n",(ulong)*(uint *)(in_RDI + 0x5d4));
  printf("mlFg_scaledLP =          %2d\n",(ulong)*(uint *)(in_RDI + 0x5d8));
  printf("mlFg_shuffledLP =        %2d\n",(ulong)*(uint *)(in_RDI + 0x5dc));
  printf("mlFg_haveBasis =         %2d\n",(ulong)*(uint *)(in_RDI + 0x5e0));
  printf("mlFg_haveMatrixColWise = %2d\n",(ulong)*(uint *)(in_RDI + 0x5e4));
  printf("mlFg_haveMatrixRowWise = %2d\n",(ulong)*(uint *)(in_RDI + 0x5e8));
  printf("mlFg_haveFactorArrays =  %2d\n",(ulong)*(uint *)(in_RDI + 0x5ec));
  printf("mlFg_haveEdWt =          %2d\n",(ulong)*(uint *)(in_RDI + 0x5f0));
  printf("mlFg_haveInvert =        %2d\n",(ulong)*(uint *)(in_RDI + 0x5f4));
  printf("mlFg_haveFreshInvert =   %2d\n",(ulong)*(uint *)(in_RDI + 0x5f8));
  printf("mlFg_haveNonbasicDuals = %2d\n",(ulong)*(uint *)(in_RDI + 0x5fc));
  printf("mlFg_haveBasicPrimals =  %2d\n",(ulong)*(uint *)(in_RDI + 0x600));
  printf("mlFg_haveFreshRebuild =  %2d\n",(ulong)*(uint *)(in_RDI + 0x604));
  printf("mlFg_haveSavedBounds =   %2d\n\n",(ulong)*(uint *)(in_RDI + 0x608));
  std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
  return;
}

Assistant:

void HModel::mlFg_Report() {
  printf("\nReporting model/solver status and flags:\n\n");
  printf("problemStatus =          %2d\n", problemStatus);
  printf("numberIteration =        %2d\n\n", numberIteration);
  printf("mlFg_transposedLP =      %2d\n", mlFg_transposedLP);
  printf("mlFg_scaledLP =          %2d\n", mlFg_scaledLP);
  printf("mlFg_shuffledLP =        %2d\n", mlFg_shuffledLP);
  printf("mlFg_haveBasis =         %2d\n", mlFg_haveBasis);
  printf("mlFg_haveMatrixColWise = %2d\n", mlFg_haveMatrixColWise);
  printf("mlFg_haveMatrixRowWise = %2d\n", mlFg_haveMatrixRowWise);
  printf("mlFg_haveFactorArrays =  %2d\n", mlFg_haveFactorArrays);
  printf("mlFg_haveEdWt =          %2d\n", mlFg_haveEdWt);
  printf("mlFg_haveInvert =        %2d\n", mlFg_haveInvert);
  printf("mlFg_haveFreshInvert =   %2d\n", mlFg_haveFreshInvert);
  printf("mlFg_haveNonbasicDuals = %2d\n", mlFg_haveNonbasicDuals);
  printf("mlFg_haveBasicPrimals =  %2d\n", mlFg_haveBasicPrimals);
  printf("mlFg_haveFreshRebuild =  %2d\n", mlFg_haveFreshRebuild);
  printf("mlFg_haveSavedBounds =   %2d\n\n", mlFg_haveSavedBounds);
  cout<<flush;
}